

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

CopyablePtr<perfetto::protos::gen::ChromeMessagePump> * __thiscall
protozero::CopyablePtr<perfetto::protos::gen::ChromeMessagePump>::operator=
          (CopyablePtr<perfetto::protos::gen::ChromeMessagePump> *this,
          CopyablePtr<perfetto::protos::gen::ChromeMessagePump> *other)

{
  ChromeMessagePump *this_00;
  CopyablePtr<perfetto::protos::gen::ChromeMessagePump> *other_local;
  CopyablePtr<perfetto::protos::gen::ChromeMessagePump> *this_local;
  
  perfetto::std::
  unique_ptr<perfetto::protos::gen::ChromeMessagePump,_std::default_delete<perfetto::protos::gen::ChromeMessagePump>_>
  ::operator=(&this->ptr_,&other->ptr_);
  this_00 = (ChromeMessagePump *)operator_new(0x40);
  perfetto::protos::gen::ChromeMessagePump::ChromeMessagePump(this_00);
  perfetto::std::
  unique_ptr<perfetto::protos::gen::ChromeMessagePump,_std::default_delete<perfetto::protos::gen::ChromeMessagePump>_>
  ::reset(&other->ptr_,this_00);
  return this;
}

Assistant:

CopyablePtr& operator=(CopyablePtr&& other) {
    ptr_ = std::move(other.ptr_);
    other.ptr_.reset(new T());
    return *this;
  }